

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfont_p.h
# Opt level: O3

bool __thiscall QFontDef::operator<(QFontDef *this,QFontDef *other)

{
  undefined1 *puVar1;
  float fVar2;
  double dVar3;
  double dVar4;
  ulong uVar5;
  ulong uVar6;
  QString *pQVar7;
  QString *pQVar8;
  QMapData<std::map<QFont::Tag,_float,_std::less<QFont::Tag>,_std::allocator<std::pair<const_QFont::Tag,_float>_>_>_>
  *pQVar9;
  QMapData<std::map<QFont::Tag,_float,_std::less<QFont::Tag>,_std::allocator<std::pair<const_QFont::Tag,_float>_>_>_>
  *pQVar10;
  compare_eq_result_container<QList<QString>,_QString> cVar11;
  bool bVar12;
  byte extraout_var;
  size_t sVar13;
  _Rb_tree_node_base *p_Var14;
  _Base_ptr p_Var15;
  size_t sVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  _Rb_tree_node_base *p_Var21;
  bool bVar22;
  QStringView QVar23;
  QStringView QVar24;
  
  dVar3 = this->pixelSize;
  dVar4 = other->pixelSize;
  if ((dVar3 != dVar4) || (NAN(dVar3) || NAN(dVar4))) {
    bVar12 = dVar4 == dVar3;
    bVar22 = dVar4 < dVar3;
LAB_004905a9:
    bVar12 = !bVar22 && !bVar12;
  }
  else {
    uVar5 = *(ulong *)&this->field_0x60;
    uVar18 = (uint)(uVar5 >> 0x20);
    uVar17 = uVar18 >> 8 & 0x3ff;
    uVar6 = *(ulong *)&other->field_0x60;
    uVar20 = (uint)(uVar6 >> 0x20);
    uVar19 = uVar20 >> 8 & 0x3ff;
    if (uVar17 != uVar19) {
      return uVar17 < uVar19;
    }
    uVar17 = (uint)(uVar5 >> 0x1c) & 3;
    uVar19 = (uint)(uVar6 >> 0x1c) & 3;
    if (uVar17 != uVar19) {
      return uVar17 < uVar19;
    }
    uVar17 = (uint)(uVar5 >> 0x10) & 0xfff;
    uVar19 = (uint)(uVar6 >> 0x10) & 0xfff;
    if (uVar17 != uVar19) {
      return uVar17 < uVar19;
    }
    uVar18 = uVar18 & 0xff;
    uVar20 = uVar20 & 0xff;
    if (uVar18 != uVar20) {
      return uVar18 < uVar20;
    }
    uVar18 = (uint)uVar5 & 0xffff;
    uVar20 = (uint)uVar6 & 0xffff;
    if (uVar18 != uVar20) {
      return uVar18 < uVar20;
    }
    cVar11 = QList<QString>::operator==(&this->families,&other->families);
    if (!cVar11) {
      pQVar7 = (this->families).d.ptr;
      pQVar8 = (other->families).d.ptr;
      bVar12 = std::
               __lexicographical_compare_impl<QList<QString>::const_iterator,QList<QString>::const_iterator,__gnu_cxx::__ops::_Iter_less_iter>
                         (pQVar7,pQVar7 + (this->families).d.size,pQVar8,
                          pQVar8 + (other->families).d.size);
      return bVar12;
    }
    bVar12 = operator!=(&this->styleName,&other->styleName);
    if (bVar12) {
      QVar23.m_data = (this->styleName).d.ptr;
      QVar23.m_size = (this->styleName).d.size;
      QVar24.m_data = (other->styleName).d.ptr;
      QVar24.m_size = (other->styleName).d.size;
      QtPrivate::compareStrings(QVar23,QVar24,CaseSensitive);
      return (bool)(extraout_var >> 7);
    }
    uVar18 = (uint)(*(ulong *)&this->field_0x60 >> 0x1e) & 3;
    uVar20 = (uint)(*(ulong *)&other->field_0x60 >> 0x1e) & 3;
    if (uVar18 != uVar20) {
      return uVar18 < uVar20;
    }
    uVar18 = (uint)(*(ulong *)&this->field_0x60 >> 0x20);
    uVar17 = uVar18 >> 0x13 & 1;
    uVar20 = (uint)(*(ulong *)&other->field_0x60 >> 0x20);
    uVar19 = uVar20 >> 0x13 & 1;
    if (uVar17 != uVar19) {
      return uVar17 < uVar19;
    }
    uVar18 = uVar18 >> 0x12 & 1;
    uVar20 = uVar20 >> 0x12 & 1;
    if (uVar18 != uVar20) {
      return uVar18 < uVar20;
    }
    bVar12 = comparesEqual<QFont::Tag,_float,_true>
                       (&this->variableAxisValues,&other->variableAxisValues);
    if (!bVar12) {
      pQVar9 = (this->variableAxisValues).d.d.ptr;
      if (pQVar9 == (QMapData<std::map<QFont::Tag,_float,_std::less<QFont::Tag>,_std::allocator<std::pair<const_QFont::Tag,_float>_>_>_>
                     *)0x0) {
        sVar13 = 0;
      }
      else {
        sVar13 = (pQVar9->m)._M_t._M_impl.super__Rb_tree_header._M_node_count;
      }
      pQVar10 = (other->variableAxisValues).d.d.ptr;
      if (pQVar10 ==
          (QMapData<std::map<QFont::Tag,_float,_std::less<QFont::Tag>,_std::allocator<std::pair<const_QFont::Tag,_float>_>_>_>
           *)0x0) {
        sVar16 = 0;
      }
      else {
        sVar16 = (pQVar10->m)._M_t._M_impl.super__Rb_tree_header._M_node_count;
      }
      if (sVar13 != sVar16) {
        if (pQVar9 == (QMapData<std::map<QFont::Tag,_float,_std::less<QFont::Tag>,_std::allocator<std::pair<const_QFont::Tag,_float>_>_>_>
                       *)0x0) {
          sVar13 = 0;
        }
        else {
          sVar13 = (pQVar9->m)._M_t._M_impl.super__Rb_tree_header._M_node_count;
        }
        if (pQVar10 ==
            (QMapData<std::map<QFont::Tag,_float,_std::less<QFont::Tag>,_std::allocator<std::pair<const_QFont::Tag,_float>_>_>_>
             *)0x0) {
          sVar16 = 0;
        }
        else {
          sVar16 = (pQVar10->m)._M_t._M_impl.super__Rb_tree_header._M_node_count;
        }
        return (long)sVar13 < (long)sVar16;
      }
      if (pQVar9 == (QMapData<std::map<QFont::Tag,_float,_std::less<QFont::Tag>,_std::allocator<std::pair<const_QFont::Tag,_float>_>_>_>
                     *)0x0) {
        p_Var14 = (_Rb_tree_node_base *)0x0;
      }
      else {
        p_Var14 = *(_Base_ptr *)
                   ((long)&(pQVar9->m)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
      }
      if (pQVar10 ==
          (QMapData<std::map<QFont::Tag,_float,_std::less<QFont::Tag>,_std::allocator<std::pair<const_QFont::Tag,_float>_>_>_>
           *)0x0) {
        p_Var15 = (_Base_ptr)0x0;
      }
      else {
        p_Var15 = *(_Base_ptr *)
                   ((long)&(pQVar10->m)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
      }
      p_Var21 = &(pQVar9->m)._M_t._M_impl.super__Rb_tree_header._M_header;
      if (pQVar9 == (QMapData<std::map<QFont::Tag,_float,_std::less<QFont::Tag>,_std::allocator<std::pair<const_QFont::Tag,_float>_>_>_>
                     *)0x0) {
        p_Var21 = (_Rb_tree_node_base *)0x0;
      }
      if (p_Var14 != p_Var21) {
        while( true ) {
          bVar22 = p_Var14[1]._M_color < p_Var15[1]._M_color;
          bVar12 = p_Var14[1]._M_color == p_Var15[1]._M_color;
          if (!bVar12) break;
          fVar2 = *(float *)&p_Var14[1].field_0x4;
          puVar1 = &p_Var15[1].field_0x4;
          bVar12 = fVar2 == *(float *)puVar1;
          bVar22 = fVar2 < *(float *)puVar1;
          if ((!bVar12) || (NAN(fVar2) || NAN(*(float *)puVar1))) break;
          p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14);
          p_Var15 = (_Base_ptr)std::_Rb_tree_increment(p_Var15);
          if (p_Var14 == p_Var21) {
            return false;
          }
        }
        goto LAB_004905a9;
      }
    }
    bVar12 = false;
  }
  return bVar12;
}

Assistant:

inline bool operator<(const QFontDef &other) const
    {
        if (pixelSize != other.pixelSize) return pixelSize < other.pixelSize;
        if (weight != other.weight) return weight < other.weight;
        if (style != other.style) return style < other.style;
        if (stretch != other.stretch) return stretch < other.stretch;
        if (styleHint != other.styleHint) return styleHint < other.styleHint;
        if (styleStrategy != other.styleStrategy) return styleStrategy < other.styleStrategy;
        if (families != other.families) return families < other.families;
        if (styleName != other.styleName)
            return styleName < other.styleName;
        if (hintingPreference != other.hintingPreference) return hintingPreference < other.hintingPreference;


        if (ignorePitch != other.ignorePitch) return ignorePitch < other.ignorePitch;
        if (fixedPitch != other.fixedPitch) return fixedPitch < other.fixedPitch;
        if (variableAxisValues != other.variableAxisValues) {
            if (variableAxisValues.size() != other.variableAxisValues.size())
                return variableAxisValues.size() < other.variableAxisValues.size();

            {
                auto it = variableAxisValues.constBegin();
                auto jt = other.variableAxisValues.constBegin();
                for (; it != variableAxisValues.constEnd(); ++it, ++jt) {
                    if (it.key() != jt.key())
                        return jt.key() < it.key();
                    if (it.value() != jt.value())
                        return jt.value() < it.value();
                }
            }
        }

        return false;
    }